

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mc_driver.cpp
# Opt level: O1

void __thiscall MC::MC_Driver::error(MC_Driver *this,string *message)

{
  ostream *poVar1;
  
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"ERROR: ",7);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)&std::cout,(message->_M_dataplus)._M_p,message->_M_string_length);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
  std::ostream::put((char)poVar1);
  std::ostream::flush();
  return;
}

Assistant:

void
MC::MC_Driver::error(const std::string &message){
    std::cout << "ERROR: "<< message << std::endl;
}